

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::Texture(Texture *this,Texture *copy)

{
  bool bVar1;
  Vector2<unsigned_int> VVar2;
  ostream *poVar3;
  Texture *in_RSI;
  Vector2<unsigned_int> *in_RDI;
  uint in_stack_000000b0;
  uint in_stack_000000b4;
  Texture *in_stack_000000b8;
  char *in_stack_000000d0;
  uint in_stack_000000dc;
  char *in_stack_000000e0;
  Texture *in_stack_ffffffffffffff88;
  Texture *in_stack_ffffffffffffff90;
  
  GlResource::GlResource((GlResource *)0x16273d);
  Vector2<unsigned_int>::Vector2(in_RDI,0,0);
  Vector2<unsigned_int>::Vector2(in_RDI + 1,0,0);
  in_RDI[2].x = 0;
  *(byte *)&in_RDI[2].y = in_RSI->m_isSmooth & 1;
  *(byte *)((long)&in_RDI[2].y + 1) = in_RSI->m_sRgb & 1;
  *(byte *)((long)&in_RDI[2].y + 2) = in_RSI->m_isRepeated & 1;
  *(undefined1 *)((long)&in_RDI[2].y + 3) = 0;
  *(undefined1 *)&in_RDI[3].x = 0;
  *(undefined1 *)((long)&in_RDI[3].x + 1) = 0;
  VVar2 = (Vector2<unsigned_int>)anon_unknown.dwarf_86926::getUniqueId();
  in_RDI[4] = VVar2;
  if (in_RSI->m_texture != 0) {
    getSize(in_RSI);
    getSize(in_RSI);
    bVar1 = create(in_stack_000000b8,in_stack_000000b4,in_stack_000000b0);
    if (bVar1) {
      update(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      glFlush();
      priv::glCheckError(in_stack_000000e0,in_stack_000000dc,in_stack_000000d0);
    }
    else {
      poVar3 = err();
      poVar3 = std::operator<<(poVar3,"Failed to copy texture, failed to create new texture");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

Texture::Texture(const Texture& copy) :
m_size         (0, 0),
m_actualSize   (0, 0),
m_texture      (0),
m_isSmooth     (copy.m_isSmooth),
m_sRgb         (copy.m_sRgb),
m_isRepeated   (copy.m_isRepeated),
m_pixelsFlipped(false),
m_fboAttachment(false),
m_hasMipmap    (false),
m_cacheId      (getUniqueId())
{
    if (copy.m_texture)
    {
        if (create(copy.getSize().x, copy.getSize().y))
        {
            update(copy);

            // Force an OpenGL flush, so that the texture will appear updated
            // in all contexts immediately (solves problems in multi-threaded apps)
            glCheck(glFlush());
        }
        else
        {
            err() << "Failed to copy texture, failed to create new texture" << std::endl;
        }
    }
}